

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

string * deqp::gles3::Performance::anon_unknown_1::FunctionCase::sumExpr
                   (string *__return_storage_ptr__,string *aExpr,string *bExpr,DataType type)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  DataType local_24;
  string *psStack_20;
  DataType type_local;
  string *bExpr_local;
  string *aExpr_local;
  
  local_24 = type;
  psStack_20 = bExpr;
  bExpr_local = aExpr;
  aExpr_local = __return_storage_ptr__;
  bVar1 = glu::isDataTypeBoolOrBVec(type);
  if (bVar1) {
    if (local_24 == TYPE_BOOL) {
      std::operator+(&local_88,"(",bExpr_local);
      std::operator+(&local_68,&local_88," == ");
      std::operator+(&local_48,&local_68,psStack_20);
      std::operator+(__return_storage_ptr__,&local_48,")");
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
    }
    else {
      std::operator+(&local_f8,"equal(",bExpr_local);
      std::operator+(&local_d8,&local_f8,", ");
      std::operator+(&local_b8,&local_d8,psStack_20);
      std::operator+(__return_storage_ptr__,&local_b8,")");
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
  }
  else {
    std::operator+(&local_158,"(",bExpr_local);
    std::operator+(&local_138,&local_158," + ");
    std::operator+(&local_118,&local_138,psStack_20);
    std::operator+(__return_storage_ptr__,&local_118,")");
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

string FunctionCase::sumExpr (const string& aExpr, const string& bExpr, glu::DataType type)
{
	if (glu::isDataTypeBoolOrBVec(type))
	{
		if (type == glu::TYPE_BOOL)
			return "(" + aExpr + " == " + bExpr + ")";
		else
			return "equal(" + aExpr + ", " + bExpr + ")";
	}
	else
		return "(" + aExpr + " + " + bExpr + ")";
}